

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  GLFWwindow *handle;
  FILE *ctx;
  exception *e;
  ImGuiIO *io;
  GLFWwindow *window;
  char **param_1_local;
  int param_0_local;
  
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  fprintf(_stdout,"Loading {Window-Main}\n");
  fflush(_stdout);
  handle = glfwCreateWindow(0x690,0x41a,"Longest Edge Bisection Demo",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    glfwTerminate();
    param_1_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fprintf(_stdout,"Loading {OpenGL}\n");
    fflush(_stdout);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      fprintf(_stdout,"gladLoadGLLoader failed\n");
      fflush(_stdout);
      param_1_local._4_4_ = -1;
    }
    else {
      fprintf(_stdout,"-- Begin -- Demo\n");
      fflush(_stdout);
      log_debug_output();
      ImGui::DebugCheckVersionAndDataLayout("1.74 WIP",0x1550,0x3b0,8,0x10,0x14,2);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::GetIO();
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplGlfw_InitForOpenGL(handle,false);
      ImGui_ImplOpenGL3_Init("#version 450");
      fprintf(_stdout,"-- Begin -- Init\n");
      ctx = _stdout;
      fflush(_stdout);
      init((EVP_PKEY_CTX *)ctx);
      fprintf(_stdout,"-- End -- Init\n");
      fflush(_stdout);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        glfwPollEvents();
        render();
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfw_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fprintf(_stdout,"-- End -- Demo\n");
      fflush(_stdout);
      param_1_local._4_4_ = 0;
    }
  }
  return param_1_local._4_4_;
}

Assistant:

int main(int, char **)
{
    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
        VIEWER_DEFAULT_WIDTH, VIEWER_DEFAULT_HEIGHT,
        "Longest Edge Bisection Demo", NULL, NULL
    );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        log_debug_output();
        IMGUI_CHECKVERSION();
        ImGui::CreateContext();
        ImGuiIO& io = ImGui::GetIO(); (void)io;
        ImGui::StyleColorsDark();
        ImGui_ImplGlfw_InitForOpenGL(window, false);
        ImGui_ImplOpenGL3_Init("#version 450");
        LOG("-- Begin -- Init\n");
        init();
        LOG("-- End -- Init\n");

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfw_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    }
    catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfw_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    catch (...) {
        ImGui_ImplGlfw_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");

    return 0;
}